

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scaler.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::Scaler::InternalSwap(Scaler *this,Scaler *other)

{
  Scaler *other_local;
  Scaler *this_local;
  
  google::protobuf::internal::InternalMetadata::InternalSwap
            (&(this->super_MessageLite)._internal_metadata_,
             &(other->super_MessageLite)._internal_metadata_);
  google::protobuf::RepeatedField<double>::InternalSwap(&this->shiftvalue_,&other->shiftvalue_);
  google::protobuf::RepeatedField<double>::InternalSwap(&this->scalevalue_,&other->scalevalue_);
  return;
}

Assistant:

void Scaler::InternalSwap(Scaler* other) {
  using std::swap;
  _internal_metadata_.InternalSwap(&other->_internal_metadata_);
  shiftvalue_.InternalSwap(&other->shiftvalue_);
  scalevalue_.InternalSwap(&other->scalevalue_);
}